

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::SEES_PDU::SEES_PDU(SEES_PDU *this,Header *H,KDataStream *stream)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header6_00228000;
  KVar1 = (H->super_Header6).m_ui8ExerciseID;
  KVar2 = (H->super_Header6).m_ui8PDUType;
  KVar3 = (H->super_Header6).m_ui8ProtocolFamily;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = (H->super_Header6).m_ui8ProtocolVersion;
  (this->super_Header).super_Header6.m_ui8ExerciseID = KVar1;
  (this->super_Header).super_Header6.m_ui8PDUType = KVar2;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = KVar3;
  (this->super_Header).super_Header6.m_TimeStamp.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__TimeStamp_00224e80;
  (this->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion =
       (H->super_Header6).m_TimeStamp.m_TimeStampUnion;
  (this->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel =
       (H->super_Header6).m_TimeStamp.m_bAutoCalcRel;
  KVar1 = (H->super_Header6).m_ui8Padding1;
  KVar2 = (H->super_Header6).m_ui8Padding2;
  (this->super_Header).super_Header6.m_ui16PDULength = (H->super_Header6).m_ui16PDULength;
  (this->super_Header).super_Header6.m_ui8Padding1 = KVar1;
  (this->super_Header).super_Header6.m_ui8Padding2 = KVar2;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Header7_00228390;
  (this->super_Header).super_Header6.field_0x26 = (H->super_Header6).field_0x26;
  *(undefined2 *)&(this->super_Header).super_Header6.field_0x24 =
       *(undefined2 *)&(H->super_Header6).field_0x24;
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__SEES_PDU_0022aca8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_OriginatingEntity);
  (this->m_vVecNozzleSys).
  super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVecNozzleSys).
  super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vPropSys).
  super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vVecNozzleSys).
  super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPropSys).
  super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPropSys).
  super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

SEES_PDU::SEES_PDU(const Header &H, KDataStream &stream) noexcept(false) :
	Header( H )
{
    Decode( stream, true );
}